

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::verifyQueryResult
          (TransformFeedbackOverflowQueryFunctionalBase *this,GLuint query,GLboolean expected)

{
  ContextInfo *pCVar1;
  GLuint GVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  GLuint GVar6;
  bool bVar7;
  GLuint checker_query;
  int local_40;
  GLuint initValue;
  GLuint check_result;
  GLuint actual;
  long lVar5;
  
  iVar4 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  pCVar1 = ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
           m_contextInfo;
  local_40 = (*pCVar1->_vptr_ContextInfo[2])(pCVar1,0x8b8d);
  (**(code **)(lVar5 + 0x6e0))(1,&checker_query);
  (**(code **)(lVar5 + 0x1680))((this->m_checker_program->m_program).m_program);
  (**(code **)(lVar5 + 0x18))(query,0x8e13);
  (**(code **)(lVar5 + 0x20))(0x8c87,checker_query);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  (**(code **)(lVar5 + 0x628))(0x8c87);
  (**(code **)(lVar5 + 0x620))();
  (**(code **)(lVar5 + 0xa20))(checker_query,0x8866,&check_result);
  GVar2 = check_result;
  GVar6 = (GLuint)CONCAT71(in_register_00000011,expected);
  bVar7 = check_result == GVar6;
  bVar3 = TransformFeedbackOverflowQueryBaseTest::supportsConditionalRenderInverted
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar3) {
    (**(code **)(lVar5 + 0x18))(query,0x8e17);
    (**(code **)(lVar5 + 0x20))(0x8c87,checker_query);
    (**(code **)(lVar5 + 0x538))(0,0,1);
    (**(code **)(lVar5 + 0x628))(0x8c87);
    (**(code **)(lVar5 + 0x620))();
    (**(code **)(lVar5 + 0xa20))(checker_query,0x8866,&check_result);
    bVar7 = check_result != GVar6 && GVar2 == GVar6;
  }
  (**(code **)(lVar5 + 0x1680))(local_40);
  (**(code **)(lVar5 + 0xa20))(query,0x8866,&actual);
  bVar7 = (bool)((GLboolean)actual == expected & bVar7);
  bVar3 = TransformFeedbackOverflowQueryBaseTest::supportsQueryBufferObject
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar3) {
    initValue = 0xdeadbeef;
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_query_buffer);
    (**(code **)(lVar5 + 0x40))(0x9192,this->m_query_buffer);
    (**(code **)(lVar5 + 0x150))(0x9192,4,&initValue,0x88e1);
    (**(code **)(lVar5 + 0xa20))(query,0x8866,0);
    (**(code **)(lVar5 + 0x7b8))(0x9192,0,4,&actual);
    (**(code **)(lVar5 + 0x438))(1,&this->m_query_buffer);
    bVar7 = (bool)(bVar7 & (GLboolean)actual == expected);
  }
  (**(code **)(lVar5 + 0x458))(1,&checker_query);
  return bVar7;
}

Assistant:

bool verifyQueryResult(GLuint query, GLboolean expected)
	{
		const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
		bool				  result = true;
		GLuint				  actual;

		GLuint current_program = m_context.getContextInfo().getInt(GL_CURRENT_PROGRAM);
		GLuint checker_query, check_result;

		// We'll use a PRIMITIVES_GENERATED query to test whether conditional
		// rendering actually executed the draw command or not. If the draw command
		// was discarded then the PRIMITIVES_GENERATED query should have a result
		// of zero.
		gl.genQueries(1, &checker_query);

		gl.useProgram(m_checker_program->getProgram());

		// Verify that conditional render discards the rendering if the expected
		// result is FALSE and renders otherwise.
		gl.beginConditionalRender(query, GL_QUERY_WAIT);
		gl.beginQuery(GL_PRIMITIVES_GENERATED, checker_query);
		gl.drawArrays(GL_POINTS, 0, 1);
		gl.endQuery(GL_PRIMITIVES_GENERATED);
		gl.endConditionalRender();
		gl.getQueryObjectuiv(checker_query, GL_QUERY_RESULT, &check_result);
		if (check_result != (GLuint)expected)
		{
			result = false;
		}

		// Verify that an inverted conditional render discards the rendering if
		// the expected result is TRUE and renders otherwise.
		if (supportsConditionalRenderInverted())
		{
			gl.beginConditionalRender(query, GL_QUERY_WAIT_INVERTED);
			gl.beginQuery(GL_PRIMITIVES_GENERATED, checker_query);
			gl.drawArrays(GL_POINTS, 0, 1);
			gl.endQuery(GL_PRIMITIVES_GENERATED);
			gl.endConditionalRender();
			gl.getQueryObjectuiv(checker_query, GL_QUERY_RESULT, &check_result);
			if (check_result == (GLuint)expected)
			{
				result = false;
			}
		}

		gl.useProgram(current_program);

		// Verify that the result of the query matches the expected result.
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &actual);
		if ((GLboolean)actual != expected)
		{
			result = false;
		}

		// Verify that the result of the query matches the expected result even
		// when using a query buffer.
		if (supportsQueryBufferObject())
		{
			const GLuint initValue = 0xDEADBEEF;

			gl.genBuffers(1, &m_query_buffer);
			gl.bindBuffer(GL_QUERY_BUFFER, m_query_buffer);
			gl.bufferData(GL_QUERY_BUFFER, sizeof(initValue), &initValue, GL_STREAM_READ);
			gl.getQueryObjectuiv(query, GL_QUERY_RESULT, NULL);
			gl.getBufferSubData(GL_QUERY_BUFFER, 0, sizeof(actual), &actual);
			gl.deleteBuffers(1, &m_query_buffer);

			if ((GLboolean)actual != expected)
			{
				result = false;
			}
		}

		gl.deleteQueries(1, &checker_query);

		return result;
	}